

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  sqlite3_module *pTokenizer;
  sqlite3_tokenizer_module *psVar2;
  Fts3PhraseToken *pFVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Mem *pMem;
  i64 iDocid;
  uchar *z;
  ulong iCol;
  Fts3DeferredToken *pFVar8;
  long in_FS_OFFSET;
  bool bVar9;
  int rc;
  int iDum2;
  int iDum1;
  int nToken;
  char *zToken;
  sqlite3_tokenizer_cursor *pTC;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  sqlite3_tokenizer_cursor *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_64 = *pRc;
  uVar4 = 0;
  if (local_64 == 0) {
    iVar7 = local_64;
    if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
      local_64 = fts3CursorSeek((sqlite3_context *)0x0,pCsr);
      iVar7 = local_64;
      if ((local_64 == 0) && (local_3c = 0, iVar7 = 0, pCsr->pDeferred != (Fts3DeferredToken *)0x0))
      {
        psVar1 = (pCsr->base).pVtab;
        pStmt = pCsr->pStmt;
        pTokenizer = psVar1[3].pModule;
        psVar2 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
        iVar7 = 0;
        pMem = columnMem(pStmt,0);
        iDocid = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        iVar5 = *(int *)&psVar1[2].pModule;
        if (0 < iVar5) {
          iVar7 = 0;
          iCol = 0;
          do {
            if (psVar1[2].zErrMsg[iCol] == '\0') {
              z = sqlite3_column_text(pCsr->pStmt,(int)iCol + 1);
              local_48 = (sqlite3_tokenizer_cursor *)0x0;
              local_3c = sqlite3Fts3OpenTokenizer
                                   ((sqlite3_tokenizer *)pTokenizer,pCsr->iLangid,(char *)z,-1,
                                    &local_48);
              iVar7 = local_3c;
              while (iVar7 == 0) {
                local_50 = &DAT_aaaaaaaaaaaaaaaa;
                local_54 = 0;
                local_58 = 0;
                local_5c = 0;
                local_60 = 0;
                local_3c = (*psVar2->xNext)(local_48,&local_50,&local_54,&local_58,&local_5c,
                                            &local_60);
                pFVar8 = pCsr->pDeferred;
                iVar7 = local_3c;
                if ((pFVar8 != (Fts3DeferredToken *)0x0) && (local_3c == 0)) {
                  iVar7 = 0;
                  do {
                    iVar5 = local_60;
                    pFVar3 = pFVar8->pToken;
                    bVar9 = true;
                    if (((iCol == (uint)pFVar8->iCol) ||
                        (*(int *)&psVar1[2].pModule <= pFVar8->iCol)) &&
                       (local_60 == 0 || pFVar3->bFirst == 0)) {
                      iVar6 = pFVar3->n;
                      if (((iVar6 == local_54) || ((iVar6 < local_54 && (pFVar3->isPrefix != 0))))
                         && (iVar6 = bcmp(local_50,pFVar3->z,(long)iVar6), iVar6 == 0)) {
                        fts3PendingListAppend(&pFVar8->pList,iDocid,iCol,(long)iVar5,&local_3c);
                        bVar9 = local_3c == 0;
                        iVar7 = local_3c;
                      }
                    }
                    pFVar8 = pFVar8->pNext;
                  } while ((pFVar8 != (Fts3DeferredToken *)0x0) && (bVar9));
                }
              }
              if (local_48 != (sqlite3_tokenizer_cursor *)0x0) {
                (*psVar2->xClose)(local_48);
              }
              if (iVar7 == 0x65) {
                local_3c = 0;
                iVar7 = 0;
              }
              iVar5 = *(int *)&psVar1[2].pModule;
              bVar9 = iVar7 == 0;
            }
            else {
              bVar9 = true;
            }
            iCol = iCol + 1;
          } while ((bVar9) && ((long)iCol < (long)iVar5));
        }
        pFVar8 = pCsr->pDeferred;
        while ((pFVar8 != (Fts3DeferredToken *)0x0 && (iVar7 == 0))) {
          iVar7 = 0;
          if (pFVar8->pList != (PendingList *)0x0) {
            iVar7 = fts3PendingListAppendVarint(&pFVar8->pList,0);
          }
          pFVar8 = pFVar8->pNext;
        }
      }
    }
    local_64 = iVar7;
    iVar7 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&local_64);
    for (pFVar8 = pCsr->pDeferred; pFVar8 != (Fts3DeferredToken *)0x0; pFVar8 = pFVar8->pNext) {
      sqlite3_free(pFVar8->pList);
      pFVar8->pList = (PendingList *)0x0;
    }
    *pRc = local_64;
    uVar4 = (uint)(iVar7 == 0 && local_64 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()).
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}